

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame2.c
# Opt level: O2

int qsort_compare(void *elem1,void *elem2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(ulong *)(*elem2 + 0x20) <= *(ulong *)(*elem1 + 0x20)) {
    uVar1 = (uint)(*(ulong *)(*elem2 + 0x20) < *(ulong *)(*elem1 + 0x20));
  }
  return uVar1;
}

Assistant:

static int
qsort_compare(const void *elem1, const void *elem2)
{
    const Dwarf_Fde fde1 = *(const Dwarf_Fde *) elem1;
    const Dwarf_Fde fde2 = *(const Dwarf_Fde *) elem2;
    Dwarf_Addr addr1 = fde1->fd_initial_location;
    Dwarf_Addr addr2 = fde2->fd_initial_location;

    if (addr1 < addr2) {
        return -1;
    } else if (addr1 > addr2) {
        return 1;
    }
    return 0;
}